

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo2(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double m10;
  double m01;
  double m00;
  double local_80;
  double local_78;
  double local_70;
  uint64_t local_68;
  double local_60;
  uint64_t local_58 [5];
  
  local_60 = 0.0;
  local_78 = 0.0;
  local_70 = getNormalMoment(this,(uint64_t *)&local_60,(uint64_t *)&local_78);
  local_78 = 0.0;
  local_80 = 4.94065645841247e-324;
  local_60 = local_70;
  local_78 = getNormalMoment(this,(uint64_t *)&local_78,(uint64_t *)&local_80);
  local_80 = 4.94065645841247e-324;
  local_68 = 0;
  local_80 = getNormalMoment(this,(uint64_t *)&local_80,&local_68);
  local_68 = 2;
  local_58[4] = 0;
  dVar1 = getCentralMoment(this,&local_68,local_58 + 4,&local_60,&local_80,&local_78);
  local_58[3] = 0;
  local_58[2] = 2;
  dVar2 = getCentralMoment(this,local_58 + 3,local_58 + 2,&local_60,&local_80,&local_78);
  local_58[1] = 1;
  local_58[0] = 1;
  dVar3 = getCentralMoment(this,local_58 + 1,local_58,&local_60,&local_80,&local_78);
  dVar4 = pow(local_70,4.0);
  return (dVar3 * dVar3 * 4.0 + (dVar1 - dVar2) * (dVar1 - dVar2)) / dVar4;
}

Assistant:

const double
Segment::getHuMomentInvariantNo2()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            std::pow(
                (
                    getCentralMoment(2, 0, m00, m10, m01) -
                    getCentralMoment(0, 2, m00, m10, m01)
                ),
                2
            )
            +
            (
                4 *
                std::pow(
                    getCentralMoment(1, 1, m00, m10, m01),
                    2
                )
            )
        )
        /
        std::pow(m00, 4)
    );
}